

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int sift_up(DdManager *table,int x,int x_low)

{
  int iVar1;
  int local_24;
  int size;
  int y;
  int x_low_local;
  int x_local;
  DdManager *table_local;
  
  local_24 = cuddNextLow(table,x);
  y = x;
  while( true ) {
    if (local_24 < x_low) {
      return 1;
    }
    iVar1 = cuddSwapInPlace(table,local_24,y);
    if (iVar1 == 0) break;
    y = local_24;
    local_24 = cuddNextLow(table,local_24);
  }
  return 0;
}

Assistant:

static int
sift_up(
  DdManager * table,
  int  x,
  int  x_low)
{
    int        y;
    int        size;

    y = cuddNextLow(table,x);
    while (y >= x_low) {
        size = cuddSwapInPlace(table,y,x);
        if (size == 0) {
            return(0);
        }
        x = y;
        y = cuddNextLow(table,x);
    }
    return(1);

}